

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::TryCallResolveOrRejectHandler
              (Var handler,Var value,ScriptContext *scriptContext)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  JavascriptLibrary *this;
  RecyclableObject *pRVar4;
  ThreadContext *pTVar5;
  JavascriptMethod p_Var6;
  Var pvVar7;
  CallInfo local_5c;
  CallInfo local_54 [2];
  undefined1 local_40 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  RecyclableObject *handlerFunc;
  Var undefinedVar;
  ScriptContext *scriptContext_local;
  Var value_local;
  Var handler_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  pRVar4 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  bVar3 = JavascriptConversion::IsCallable(handler);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  autoReentrancyHandler._8_8_ = VarTo<Js::RecyclableObject>(handler);
  pTVar5 = ScriptContext::GetThreadContext(scriptContext);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_40,pTVar5);
  pTVar5 = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar5);
  pTVar5 = ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::AssertJsReentrancy(pTVar5);
  uVar1 = autoReentrancyHandler._8_8_;
  p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler._8_8_);
  CheckIsExecutable((RecyclableObject *)uVar1,p_Var6);
  p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)autoReentrancyHandler._8_8_);
  uVar1 = autoReentrancyHandler._8_8_;
  CallInfo::CallInfo(local_54,CallFlags_Value,2);
  uVar2 = autoReentrancyHandler._8_8_;
  CallInfo::CallInfo(&local_5c,CallFlags_Value,2);
  pvVar7 = (*p_Var6)((RecyclableObject *)uVar1,(CallInfo)uVar2,local_54[0],0,0,0,0,local_5c,pRVar4,
                     value);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_40);
  return pvVar7;
}

Assistant:

Var JavascriptPromise::TryCallResolveOrRejectHandler(Var handler, Var value, ScriptContext* scriptContext)
    {
        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();

        if (!JavascriptConversion::IsCallable(handler))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }

        RecyclableObject* handlerFunc = VarTo<RecyclableObject>(handler);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                    handlerFunc, CallInfo(CallFlags_Value, 2),
                    undefinedVar,
                    value);
        }
        END_SAFE_REENTRANT_CALL
    }